

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SplitNDLayerParams::InternalSwap
          (SplitNDLayerParams *this,SplitNDLayerParams *other)

{
  intptr_t iVar1;
  int64_t iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->splitsizes_,&other->splitsizes_);
  iVar2 = this->axis_;
  uVar3 = this->numsplits_;
  uVar4 = other->numsplits_;
  this->axis_ = other->axis_;
  this->numsplits_ = uVar4;
  other->axis_ = iVar2;
  other->numsplits_ = uVar3;
  return;
}

Assistant:

void SplitNDLayerParams::InternalSwap(SplitNDLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  splitsizes_.InternalSwap(&other->splitsizes_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(SplitNDLayerParams, numsplits_)
      + sizeof(SplitNDLayerParams::numsplits_)
      - PROTOBUF_FIELD_OFFSET(SplitNDLayerParams, axis_)>(
          reinterpret_cast<char*>(&axis_),
          reinterpret_cast<char*>(&other->axis_));
}